

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O2

int ON_DBL::CompareValue(double lhs,double rhs)

{
  int iVar1;
  
  if (rhs <= lhs) {
    if (lhs <= rhs) {
      if ((lhs == rhs) && (!NAN(lhs) && !NAN(rhs))) {
        return 0;
      }
      return (uint)NAN(lhs) - (uint)NAN(rhs);
    }
    iVar1 = 1;
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int ON_DBL::CompareValue(double lhs, double rhs)
{
  if (lhs < rhs)
    return -1;
  if (lhs > rhs)
    return 1;
  if (lhs == rhs)
    return 0; 

  // At least one of lhs or rhs is a nan. Sort nans to end
  return (ON_IS_NAN(lhs) ? 1 : 0) - (ON_IS_NAN(rhs) ? 1 : 0);
}